

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_gej_eq_x_var(secp256k1_fe *x,secp256k1_gej *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  secp256k1_gej *psVar8;
  int64_t iVar9;
  int64_t iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  secp256k1_modinv64_signed62 *psVar14;
  byte bVar15;
  uint uVar16;
  secp256k1_gej *psVar17;
  ulong *extraout_RDX;
  long lVar18;
  long lVar19;
  long lVar20;
  secp256k1_modinv64_signed62 *a_00;
  long *extraout_RDX_00;
  secp256k1_modinv64_signed62 *b;
  int iVar21;
  secp256k1_gej *psVar22;
  secp256k1_gej *psVar23;
  long lVar24;
  secp256k1_gej *unaff_RBP;
  secp256k1_gej *a_01;
  secp256k1_gej *psVar25;
  secp256k1_modinv64_signed62 *psVar26;
  secp256k1_modinv64_signed62 *psVar27;
  secp256k1_gej *psVar28;
  secp256k1_gej *a_02;
  secp256k1_gej *psVar29;
  secp256k1_modinv64_signed62 *a_03;
  secp256k1_gej *psVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  secp256k1_gej *psVar34;
  uint64_t *puVar35;
  long lVar36;
  undefined1 *puVar37;
  secp256k1_gej *psVar38;
  long lVar39;
  secp256k1_gej *psVar40;
  long lVar41;
  long lVar42;
  secp256k1_gej *psVar43;
  bool bVar44;
  secp256k1_fe r;
  secp256k1_modinv64_signed62 sStack_2c8;
  secp256k1_modinv64_signed62 sStack_2a0;
  secp256k1_gej *psStack_278;
  secp256k1_gej *psStack_270;
  secp256k1_gej *psStack_268;
  ulong uStack_260;
  secp256k1_gej *psStack_258;
  ulong uStack_250;
  secp256k1_gej *psStack_248;
  secp256k1_gej *psStack_240;
  long lStack_238;
  secp256k1_gej *psStack_230;
  secp256k1_gej *psStack_228;
  secp256k1_gej *psStack_220;
  uint64_t uStack_218;
  secp256k1_gej *psStack_210;
  secp256k1_gej *psStack_208;
  secp256k1_gej *psStack_200;
  secp256k1_gej *psStack_1f8;
  uint64_t uStack_1f0;
  secp256k1_gej *psStack_1e8;
  secp256k1_gej *psStack_1e0;
  secp256k1_gej *psStack_1d8;
  secp256k1_gej *psStack_1d0;
  secp256k1_gej *psStack_1c8;
  secp256k1_gej *psStack_1c0;
  long lStack_1b8;
  secp256k1_gej *psStack_1b0;
  code *pcStack_1a8;
  uint uStack_19c;
  secp256k1_gej *psStack_198;
  secp256k1_gej *apsStack_190 [2];
  undefined1 auStack_180 [56];
  uint64_t uStack_148;
  uint64_t uStack_140;
  uint64_t uStack_138;
  uint64_t uStack_130;
  secp256k1_modinv64_trans2x2 sStack_120;
  secp256k1_modinv64_signed62 sStack_100;
  secp256k1_modinv64_signed62 sStack_d0;
  secp256k1_gej *psStack_a8;
  secp256k1_fe sStack_48;
  
  psVar43 = a;
  secp256k1_fe_verify(x);
  psVar28 = a;
  secp256k1_gej_verify(a);
  if (a->infinity == 0) {
    secp256k1_fe_sqr(&sStack_48,&a->z);
    secp256k1_fe_mul(&sStack_48,&sStack_48,x);
    iVar6 = secp256k1_fe_equal(&sStack_48,&a->x);
    return iVar6;
  }
  secp256k1_gej_eq_x_var_cold_1();
  psVar25 = psVar43;
  secp256k1_fe_verify(&psVar28->x);
  psVar29 = psVar43;
  secp256k1_fe_verify(&psVar43->x);
  if ((psVar28->x).normalized == 0) {
    secp256k1_fe_cmp_var_cold_2();
  }
  else if ((psVar43->x).normalized != 0) {
    uVar7 = 4;
    while( true ) {
      uVar11 = (psVar43->x).n[uVar7];
      uVar12 = (psVar28->x).n[uVar7];
      if (uVar12 >= uVar11 && uVar12 != uVar11) {
        return 1;
      }
      if (uVar12 < uVar11) break;
      bVar44 = uVar7 == 0;
      uVar7 = uVar7 - 1;
      if (bVar44) {
        return 0;
      }
    }
    return -1;
  }
  secp256k1_fe_cmp_var_cold_1();
  psVar43 = psVar25;
  secp256k1_fe_verify(&psVar29->x);
  psVar28 = psVar25;
  secp256k1_fe_verify(&psVar25->x);
  iVar6 = (psVar25->x).magnitude + (psVar29->x).magnitude;
  if (iVar6 < 0x21) {
    (psVar29->x).n[0] = (psVar29->x).n[0] + (psVar25->x).n[0];
    puVar35 = (psVar29->x).n + 1;
    *puVar35 = *puVar35 + (psVar25->x).n[1];
    puVar35 = (psVar29->x).n + 2;
    *puVar35 = *puVar35 + (psVar25->x).n[2];
    puVar35 = (psVar29->x).n + 3;
    *puVar35 = *puVar35 + (psVar25->x).n[3];
    puVar35 = (psVar29->x).n + 4;
    *puVar35 = *puVar35 + (psVar25->x).n[4];
    (psVar29->x).magnitude = iVar6;
    (psVar29->x).normalized = 0;
    secp256k1_fe_verify(&psVar29->x);
    return extraout_EAX;
  }
  secp256k1_fe_add_cold_1();
  sStack_100.v[2] = 0;
  sStack_100.v[3] = 0;
  sStack_100.v[0] = 0;
  sStack_100.v[1] = 0;
  psVar25 = (secp256k1_gej *)0x0;
  sStack_100.v[4] = 0;
  sStack_d0.v[1] = 0;
  sStack_d0.v[4] = 0;
  sStack_d0.v[2] = 0;
  sStack_d0.v[3] = 0;
  sStack_d0.v[0] = 1;
  uStack_130 = (psVar43->x).n[4];
  auStack_180._48_8_ = (psVar43->x).n[0];
  uStack_148 = (psVar43->x).n[1];
  uStack_140 = (psVar43->x).n[2];
  uStack_138 = (psVar43->x).n[3];
  auStack_180._32_8_ = (psVar28->x).n[4];
  auStack_180._0_8_ = (psVar28->x).n[0];
  auStack_180._8_8_ = (psVar28->x).n[1];
  auStack_180._16_8_ = (psVar28->x).n[2];
  auStack_180._24_8_ = (psVar28->x).n[3];
  lVar42 = -1;
  psVar22 = (secp256k1_gej *)0x5;
  psStack_198 = psVar28;
  apsStack_190[0] = psVar43;
  psStack_a8 = psVar29;
  do {
    psVar28 = (secp256k1_gej *)auStack_180._48_8_;
    psVar23 = apsStack_190[0];
    uStack_19c = (uint)psVar22;
    psVar8 = (secp256k1_gej *)0x0;
    psVar34 = (secp256k1_gej *)0x0;
    psVar30 = (secp256k1_gej *)0x1;
    uVar7 = 0x3e;
    a_01 = (secp256k1_gej *)0x1;
    puVar37 = (undefined1 *)auStack_180._0_8_;
    psVar29 = (secp256k1_gej *)auStack_180._48_8_;
    while( true ) {
      a_02 = (secp256k1_gej *)(-1L << ((byte)uVar7 & 0x3f) | (ulong)puVar37);
      psVar17 = (secp256k1_gej *)0x0;
      if (a_02 != (secp256k1_gej *)0x0) {
        for (; ((ulong)a_02 >> (long)psVar17 & 1) == 0;
            psVar17 = (secp256k1_gej *)((long)(psVar17->x).n + 1)) {
        }
      }
      bVar15 = (byte)psVar17;
      psVar38 = (secp256k1_gej *)((ulong)puVar37 >> (bVar15 & 0x3f));
      a_01 = (secp256k1_gej *)((long)a_01 << (bVar15 & 0x3f));
      psVar8 = (secp256k1_gej *)((long)psVar8 << (bVar15 & 0x3f));
      lVar42 = lVar42 - (long)psVar17;
      uVar7 = uVar7 - (int)psVar17;
      apsStack_190[1] = psVar25;
      if (uVar7 == 0) break;
      if (((ulong)psVar29 & 1) == 0) {
        pcStack_1a8 = (code *)0x14b063;
        secp256k1_modinv64_var_cold_8();
LAB_0014b063:
        pcStack_1a8 = (code *)0x14b068;
        secp256k1_modinv64_var_cold_7();
LAB_0014b068:
        pcStack_1a8 = (code *)0x14b06d;
        secp256k1_modinv64_var_cold_1();
LAB_0014b06d:
        pcStack_1a8 = (code *)0x14b072;
        secp256k1_modinv64_var_cold_2();
LAB_0014b072:
        pcStack_1a8 = (code *)0x14b077;
        secp256k1_modinv64_var_cold_6();
        psVar38 = psVar29;
        goto LAB_0014b077;
      }
      if (((ulong)psVar38 & 1) == 0) goto LAB_0014b063;
      a_02 = (secp256k1_gej *)((long)psVar8 * auStack_180._0_8_ + (long)a_01 * auStack_180._48_8_);
      psVar17 = (secp256k1_gej *)(ulong)(0x3e - uVar7);
      bVar15 = (byte)(0x3e - uVar7);
      psVar22 = (secp256k1_gej *)((long)psVar29 << (bVar15 & 0x3f));
      if (a_02 != psVar22) goto LAB_0014b068;
      psVar22 = (secp256k1_gej *)
                ((long)psVar30 * auStack_180._0_8_ + (long)psVar34 * auStack_180._48_8_);
      a_02 = (secp256k1_gej *)((long)psVar38 << (bVar15 & 0x3f));
      if (psVar22 != a_02) goto LAB_0014b06d;
      psVar17 = (secp256k1_gej *)(lVar42 - 0x2ea);
      if (psVar17 < (secp256k1_gej *)0xfffffffffffffa2d) goto LAB_0014b072;
      iVar6 = (int)psVar38;
      if (lVar42 < 0) {
        lVar42 = -lVar42;
        uVar16 = (int)lVar42 + 1;
        if ((int)uVar7 <= (int)uVar16) {
          uVar16 = uVar7;
        }
        psVar17 = (secp256k1_gej *)(ulong)uVar16;
        a_02 = (secp256k1_gej *)(ulong)(uVar16 - 0x3f);
        if (0xffffffc1 < uVar16 - 0x3f) {
          psVar40 = (secp256k1_gej *)-(long)psVar8;
          unaff_RBP = (secp256k1_gej *)-(long)a_01;
          psVar17 = (secp256k1_gej *)-(long)psVar29;
          psVar22 = (secp256k1_gej *)
                    ((ulong)(0x3fL << (-(char)uVar16 & 0x3fU)) >> (-(char)uVar16 & 0x3fU));
          uVar16 = (iVar6 * iVar6 + 0x3e) * iVar6 * (int)psVar17 & (uint)psVar22;
          psVar8 = psVar30;
          a_01 = psVar34;
          psVar43 = psVar40;
          goto LAB_0014ad3d;
        }
        goto LAB_0014b081;
      }
      uVar16 = (int)lVar42 + 1;
      if ((int)uVar7 <= (int)uVar16) {
        uVar16 = uVar7;
      }
      psVar17 = (secp256k1_gej *)(ulong)uVar16;
      a_02 = (secp256k1_gej *)(ulong)(uVar16 - 0x3f);
      if (uVar16 - 0x3f < 0xffffffc2) goto LAB_0014b07c;
      psVar22 = (secp256k1_gej *)
                ((ulong)(0xfL << (-(char)uVar16 & 0x3fU)) >> (-(char)uVar16 & 0x3fU));
      uVar16 = -(iVar6 * (((int)psVar29 * 2 + 2U & 8) + (int)psVar29)) & (uint)psVar22;
      unaff_RBP = psVar34;
      psVar40 = psVar30;
      psVar17 = psVar38;
      psVar38 = psVar29;
LAB_0014ad3d:
      uVar11 = (ulong)uVar16;
      a_02 = (secp256k1_gej *)(uVar11 * (long)psVar38);
      puVar37 = (undefined1 *)((long)(psVar17->x).n + (long)(a_02->x).n);
      psVar34 = (secp256k1_gej *)((long)(unaff_RBP->x).n + (long)a_01 * uVar11);
      psVar17 = (secp256k1_gej *)(uVar11 * (long)psVar8);
      psVar30 = (secp256k1_gej *)((long)(psVar40->x).n + (long)(psVar17->x).n);
      psVar29 = psVar38;
      if (((ulong)puVar37 & (ulong)psVar22) != 0) {
LAB_0014b077:
        pcStack_1a8 = (code *)0x14b07c;
        secp256k1_modinv64_var_cold_4();
        psVar29 = psVar38;
LAB_0014b07c:
        pcStack_1a8 = (code *)0x14b081;
        secp256k1_modinv64_var_cold_3();
LAB_0014b081:
        pcStack_1a8 = (code *)0x14b086;
        secp256k1_modinv64_var_cold_5();
        goto LAB_0014b086;
      }
    }
    a_02 = (secp256k1_gej *)((long)psVar8 * (long)psVar34);
    psVar17 = SUB168(SEXT816((long)psVar8) * SEXT816((long)psVar34),8);
    sStack_120.u = (int64_t)a_01;
    sStack_120.v = (int64_t)psVar8;
    sStack_120.q = (int64_t)psVar34;
    sStack_120.r = (int64_t)psVar30;
    if ((long)a_01 * (long)psVar30 - (long)a_02 != 0x4000000000000000 ||
        SUB168(SEXT816((long)a_01) * SEXT816((long)psVar30),8) - (long)psVar17 !=
        (ulong)((secp256k1_gej *)((long)a_01 * (long)psVar30) < a_02)) {
LAB_0014b086:
      pcStack_1a8 = (code *)0x14b08b;
      secp256k1_modinv64_var_cold_9();
      psVar23 = psVar43;
LAB_0014b08b:
      pcStack_1a8 = (code *)0x14b090;
      secp256k1_modinv64_var_cold_20();
LAB_0014b090:
      pcStack_1a8 = (code *)0x14b095;
      secp256k1_modinv64_var_cold_19();
LAB_0014b095:
      pcStack_1a8 = (code *)0x14b09a;
      secp256k1_modinv64_var_cold_18();
      psVar25 = psVar28;
LAB_0014b09a:
      pcStack_1a8 = (code *)0x14b09f;
      secp256k1_modinv64_var_cold_17();
LAB_0014b09f:
      pcStack_1a8 = (code *)0x14b0a4;
      secp256k1_modinv64_var_cold_14();
LAB_0014b0a4:
      pcStack_1a8 = (code *)0x14b0a9;
      secp256k1_modinv64_var_cold_13();
LAB_0014b0a9:
      pcStack_1a8 = (code *)0x14b0ae;
      secp256k1_modinv64_var_cold_12();
LAB_0014b0ae:
      pcStack_1a8 = (code *)0x14b0b3;
      secp256k1_modinv64_var_cold_11();
LAB_0014b0b3:
      pcStack_1a8 = (code *)0x14b0b8;
      secp256k1_modinv64_var_cold_10();
      goto LAB_0014b0b8;
    }
    pcStack_1a8 = (code *)0x14adcb;
    secp256k1_modinv64_update_de_62
              (&sStack_100,&sStack_d0,&sStack_120,(secp256k1_modinv64_modinfo *)apsStack_190[0]);
    uVar7 = uStack_19c;
    psVar29 = (secp256k1_gej *)(auStack_180 + 0x30);
    psVar22 = (secp256k1_gej *)(ulong)uStack_19c;
    a_01 = (secp256k1_gej *)(ulong)uStack_19c;
    psVar17 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_1a8 = (code *)0x14ade8;
    a_02 = psVar29;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar29,uStack_19c,
                       (secp256k1_modinv64_signed62 *)psVar23,-1);
    if (iVar6 < 1) goto LAB_0014b08b;
    psVar17 = (secp256k1_gej *)0x1;
    a_01 = (secp256k1_gej *)(ulong)uVar7;
    pcStack_1a8 = (code *)0x14ae02;
    a_02 = psVar29;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar29,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar23,1);
    if (0 < iVar6) goto LAB_0014b090;
    psVar28 = (secp256k1_gej *)auStack_180;
    a_01 = (secp256k1_gej *)(ulong)uVar7;
    psVar17 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_1a8 = (code *)0x14ae23;
    a_02 = psVar28;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar23,-1);
    if (iVar6 < 1) goto LAB_0014b095;
    psVar17 = (secp256k1_gej *)0x1;
    a_01 = (secp256k1_gej *)(ulong)uVar7;
    pcStack_1a8 = (code *)0x14ae3d;
    a_02 = psVar28;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar23,1);
    psVar25 = psVar28;
    if (-1 < iVar6) goto LAB_0014b09a;
    pcStack_1a8 = (code *)0x14ae5a;
    secp256k1_modinv64_update_fg_62_var
              (uVar7,(secp256k1_modinv64_signed62 *)psVar29,(secp256k1_modinv64_signed62 *)psVar28,
               &sStack_120);
    psVar25 = apsStack_190[1];
    if ((undefined1 *)auStack_180._0_8_ != (undefined1 *)0x0) {
LAB_0014ae6b:
      lVar18 = (long)(int)uVar7;
      uVar11 = *(ulong *)(auStack_180 + lVar18 * 8 + 0x28);
      psVar17 = apsStack_190[lVar18 + 1];
      a_02 = (secp256k1_gej *)((long)uVar11 >> 0x3f ^ uVar11 | lVar18 + -2 >> 0x3f);
      a_01 = (secp256k1_gej *)((long)psVar17 >> 0x3f ^ (ulong)psVar17 | (ulong)a_02);
      if (a_01 == (secp256k1_gej *)0x0) {
        psVar22 = (secp256k1_gej *)(ulong)(uVar7 - 1);
        *(ulong *)(auStack_180 + lVar18 * 8 + 0x20) =
             *(ulong *)(auStack_180 + lVar18 * 8 + 0x20) | uVar11 << 0x3e;
        psVar17 = (secp256k1_gej *)((long)psVar17 << 0x3e);
        apsStack_190[lVar18] = (secp256k1_gej *)((ulong)apsStack_190[lVar18] | (ulong)psVar17);
      }
      if (10 < (int)psVar25) goto LAB_0014b09f;
      psVar17 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_1a8 = (code *)0x14aece;
      iVar21 = (int)psVar22;
      a_01 = psVar22;
      a_02 = psVar29;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar29,iVar21,
                         (secp256k1_modinv64_signed62 *)psVar23,-1);
      if (iVar6 < 1) goto LAB_0014b0a4;
      psVar17 = (secp256k1_gej *)0x1;
      pcStack_1a8 = (code *)0x14aee8;
      a_01 = psVar22;
      a_02 = psVar29;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar29,iVar21,
                         (secp256k1_modinv64_signed62 *)psVar23,1);
      if (0 < iVar6) goto LAB_0014b0a9;
      psVar29 = (secp256k1_gej *)auStack_180;
      psVar17 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_1a8 = (code *)0x14af09;
      a_01 = psVar22;
      a_02 = psVar29;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar29,iVar21,
                         (secp256k1_modinv64_signed62 *)psVar23,-1);
      if (iVar6 < 1) goto LAB_0014b0ae;
      psVar17 = (secp256k1_gej *)0x1;
      pcStack_1a8 = (code *)0x14af23;
      a_01 = psVar22;
      a_02 = psVar29;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar29,iVar21,
                         (secp256k1_modinv64_signed62 *)psVar23,1);
      if (iVar6 < 0) {
        bVar44 = true;
        psVar25 = (secp256k1_gej *)(ulong)((int)psVar25 + 1);
        goto LAB_0014af58;
      }
      goto LAB_0014b0b3;
    }
    if (1 < (int)uVar7) {
      uVar11 = 1;
      uVar12 = 0;
      do {
        uVar12 = uVar12 | *(ulong *)(auStack_180 + uVar11 * 8);
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
      if (uVar12 != 0) goto LAB_0014ae6b;
    }
    bVar44 = false;
LAB_0014af58:
    psVar43 = psVar23;
  } while (bVar44);
  a_02 = (secp256k1_gej *)auStack_180;
  iVar21 = (int)psVar22;
  psVar17 = (secp256k1_gej *)0x0;
  pcStack_1a8 = (code *)0x14af75;
  a_01 = psVar22;
  iVar6 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_02,iVar21,&SECP256K1_SIGNED62_ONE,0);
  if (iVar6 == 0) {
    pcStack_1a8 = (code *)0x14af97;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)(auStack_180 + 0x30),iVar21,
                       &SECP256K1_SIGNED62_ONE,-1);
    psVar25 = psStack_198;
    if (iVar6 == 0) {
LAB_0014b019:
      pcStack_1a8 = (code *)0x14b034;
      secp256k1_modinv64_normalize_62
                (&sStack_100,*(int64_t *)(auStack_180 + (long)iVar21 * 8 + 0x28),
                 (secp256k1_modinv64_modinfo *)psVar23);
      (psVar25->x).n[4] = sStack_100.v[4];
      (psVar25->x).n[2] = sStack_100.v[2];
      (psVar25->x).n[3] = sStack_100.v[3];
      (psVar25->x).n[0] = sStack_100.v[0];
      (psVar25->x).n[1] = sStack_100.v[1];
      return (int)sStack_100.v[4];
    }
    pcStack_1a8 = (code *)0x14afb8;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)(auStack_180 + 0x30),iVar21,
                       &SECP256K1_SIGNED62_ONE,1);
    if (iVar6 == 0) goto LAB_0014b019;
    a_01 = (secp256k1_gej *)0x5;
    psVar17 = (secp256k1_gej *)0x0;
    pcStack_1a8 = (code *)0x14afd2;
    a_02 = psVar25;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar25,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar6 == 0) {
      a_02 = (secp256k1_gej *)&sStack_100;
      a_01 = (secp256k1_gej *)0x5;
      psVar17 = (secp256k1_gej *)0x0;
      pcStack_1a8 = (code *)0x14aff5;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_02,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar6 == 0) {
        a_02 = (secp256k1_gej *)(auStack_180 + 0x30);
        psVar17 = (secp256k1_gej *)0x1;
        pcStack_1a8 = (code *)0x14b011;
        a_01 = psVar22;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_02,iVar21,
                           (secp256k1_modinv64_signed62 *)psVar23,1);
        if (iVar6 == 0) goto LAB_0014b019;
      }
    }
  }
  else {
LAB_0014b0b8:
    pcStack_1a8 = (code *)0x14b0bd;
    secp256k1_modinv64_var_cold_15();
  }
  pcStack_1a8 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_16();
  uVar11 = (a_01->x).n[0];
  if (uVar11 >> 0x3e == 0) {
    uVar12 = (a_01->x).n[1];
    if (0x3fffffffffffffff < uVar12) goto LAB_0014b14c;
    psVar17 = (secp256k1_gej *)(a_01->x).n[2];
    if ((secp256k1_gej *)0x3fffffffffffffff < psVar17) goto LAB_0014b151;
    uVar13 = (a_01->x).n[3];
    if (0x3fffffffffffffff < uVar13) goto LAB_0014b156;
    a_01 = (secp256k1_gej *)(a_01->x).n[4];
    if (a_01 < (secp256k1_gej *)&DAT_00000100) {
      (a_02->x).n[0] = uVar12 << 0x3e | uVar11;
      (a_02->x).n[1] = (long)psVar17 << 0x3c | uVar12 >> 2;
      (a_02->x).n[2] = uVar13 << 0x3a | (ulong)psVar17 >> 4;
      (a_02->x).n[3] = (long)a_01 << 0x38 | uVar13 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_02);
      return extraout_EAX_00;
    }
  }
  else {
    psStack_1b0 = (secp256k1_gej *)0x14b14c;
    secp256k1_scalar_from_signed62_cold_5();
LAB_0014b14c:
    psStack_1b0 = (secp256k1_gej *)0x14b151;
    secp256k1_scalar_from_signed62_cold_4();
LAB_0014b151:
    psStack_1b0 = (secp256k1_gej *)0x14b156;
    secp256k1_scalar_from_signed62_cold_3();
LAB_0014b156:
    psStack_1b0 = (secp256k1_gej *)0x14b15b;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_1b0 = (secp256k1_gej *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_1b0 = unaff_RBP;
  lStack_1b8 = lVar42;
  psStack_1c0 = psVar25;
  psStack_1c8 = psVar29;
  psStack_1d0 = psVar23;
  psStack_1d8 = psVar22;
  uVar1 = (a_02->x).n[0];
  psStack_1e8 = (secp256k1_gej *)(a_02->x).n[1];
  psStack_1f8 = (secp256k1_gej *)(a_02->x).n[2];
  uStack_218 = (a_02->x).n[3];
  psStack_208 = (secp256k1_gej *)(a_02->x).n[4];
  psVar43 = (secp256k1_gej *)(a_01->x).n[0];
  psStack_1e0 = (secp256k1_gej *)(a_01->x).n[1];
  uStack_1f0 = (a_01->x).n[2];
  uStack_250 = *extraout_RDX;
  psStack_248 = (secp256k1_gej *)extraout_RDX[1];
  uStack_260 = extraout_RDX[2];
  psStack_258 = (secp256k1_gej *)extraout_RDX[3];
  psVar28 = (secp256k1_gej *)(a_01->x).n[3];
  psStack_210 = (secp256k1_gej *)(a_01->x).n[4];
  psVar25 = (secp256k1_gej *)0x5;
  psVar22 = (secp256k1_gej *)0xfffffffffffffffe;
  psStack_268 = (secp256k1_gej *)0x14b1fc;
  psVar29 = a_02;
  iVar6 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_02,5,(secp256k1_modinv64_signed62 *)psVar17,-2
                    );
  if (iVar6 < 1) {
    psStack_268 = (secp256k1_gej *)0x14bd1c;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014bd1c:
    psStack_268 = (secp256k1_gej *)0x14bd21;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_0014bd21:
    psStack_268 = (secp256k1_gej *)0x14bd26;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_0014bd26:
    psStack_268 = (secp256k1_gej *)0x14bd2b;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014bd2b:
    psStack_268 = (secp256k1_gej *)0x14bd30;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_0014bd30:
    psStack_268 = (secp256k1_gej *)0x14bd35;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_0014bd35:
    psStack_268 = (secp256k1_gej *)0x14bd3a;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_0014bd3a:
    psStack_268 = (secp256k1_gej *)0x14bd3f;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar23 = psVar17;
LAB_0014bd3f:
    psStack_268 = (secp256k1_gej *)0x14bd44;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_0014bd44:
    psStack_268 = (secp256k1_gej *)0x14bd49;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0014bd49:
    psStack_268 = (secp256k1_gej *)0x14bd4e;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar8 = psVar23;
LAB_0014bd4e:
    psStack_268 = (secp256k1_gej *)0x14bd53;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_0014bd53:
    psStack_268 = (secp256k1_gej *)0x14bd58;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_0014bd58:
    psStack_268 = (secp256k1_gej *)0x14bd5d;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_0014bd5d:
    psStack_268 = (secp256k1_gej *)0x14bd62;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0014bd62:
    psStack_268 = (secp256k1_gej *)0x14bd67;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_0014bd67:
    psStack_268 = (secp256k1_gej *)0x14bd6c;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_0014bd6c:
    psStack_268 = (secp256k1_gej *)0x14bd71;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_0014bd71:
    psStack_268 = (secp256k1_gej *)0x14bd76;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0014bd76:
    psStack_268 = (secp256k1_gej *)0x14bd7b;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_0014bd7b:
    psStack_268 = (secp256k1_gej *)0x14bd80;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_0014bd80:
    psVar28 = psVar43;
    a_01 = a_02;
    psStack_268 = (secp256k1_gej *)0x14bd85;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_0014bd85:
    psStack_268 = (secp256k1_gej *)0x14bd8a;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_0014bd8a:
    psStack_268 = (secp256k1_gej *)0x14bd8f;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_0014bd8f:
    psStack_268 = (secp256k1_gej *)0x14bd94;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_0014bd94:
    psStack_268 = (secp256k1_gej *)0x14bd99;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_0014bd99:
    psStack_268 = (secp256k1_gej *)0x14bd9e;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_0014bd9e:
    psStack_268 = (secp256k1_gej *)0x14bda3;
    secp256k1_modinv64_update_de_62_cold_23();
    a_02 = a_01;
    psVar30 = psVar28;
LAB_0014bda3:
    psStack_268 = (secp256k1_gej *)0x14bda8;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_0014bda8:
    psStack_268 = (secp256k1_gej *)0x14bdad;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0014bdad:
    psStack_268 = (secp256k1_gej *)0x14bdb2;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0014bdb2:
    psVar23 = psVar22;
    psStack_268 = (secp256k1_gej *)0x14bdb7;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_0014bdb7:
    uVar7 = (uint)psVar25;
    psStack_268 = (secp256k1_gej *)0x14bdbc;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar22 = (secp256k1_gej *)0x1;
    psVar25 = (secp256k1_gej *)0x5;
    psStack_268 = (secp256k1_gej *)0x14b219;
    psVar29 = a_02;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_02,5,(secp256k1_modinv64_signed62 *)psVar17,
                       1);
    if (-1 < iVar6) goto LAB_0014bd1c;
    psVar25 = (secp256k1_gej *)0x5;
    psVar22 = (secp256k1_gej *)0xfffffffffffffffe;
    psStack_268 = (secp256k1_gej *)0x14b238;
    psVar29 = a_01;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_01,5,(secp256k1_modinv64_signed62 *)psVar17,
                       -2);
    if (iVar6 < 1) goto LAB_0014bd21;
    psVar22 = (secp256k1_gej *)0x1;
    psVar25 = (secp256k1_gej *)0x5;
    psStack_268 = (secp256k1_gej *)0x14b255;
    psVar29 = a_01;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_01,5,(secp256k1_modinv64_signed62 *)psVar17,
                       1);
    if (-1 < iVar6) goto LAB_0014bd26;
    psStack_268 = (secp256k1_gej *)0x14b27b;
    psStack_228 = a_02;
    psStack_200 = psVar28;
    iVar9 = secp256k1_modinv64_abs(uStack_250);
    psStack_268 = (secp256k1_gej *)0x14b288;
    psVar29 = psStack_248;
    iVar10 = secp256k1_modinv64_abs((int64_t)psStack_248);
    psVar22 = (secp256k1_gej *)(0x4000000000000000 - iVar10);
    a_02 = (secp256k1_gej *)0x3fffffffffffffff;
    if ((long)psVar22 < iVar9) goto LAB_0014bd2b;
    psStack_268 = (secp256k1_gej *)0x14b2a3;
    iVar9 = secp256k1_modinv64_abs(uStack_260);
    psStack_268 = (secp256k1_gej *)0x14b2b0;
    psVar29 = psStack_258;
    iVar10 = secp256k1_modinv64_abs((int64_t)psStack_258);
    psVar28 = psStack_228;
    psVar22 = (secp256k1_gej *)(0x4000000000000000 - iVar10);
    if ((long)psVar22 < iVar9) goto LAB_0014bd30;
    a_02 = (secp256k1_gej *)0x7fffffffffffffff;
    psVar25 = (secp256k1_gej *)(uStack_250 * uVar1);
    psVar22 = SUB168(SEXT816((long)uStack_250) * SEXT816((long)uVar1),8);
    uVar11 = (long)psStack_248 * (long)psVar43;
    lVar18 = SUB168(SEXT816((long)psStack_248) * SEXT816((long)psVar43),8);
    lVar42 = (0x7fffffffffffffff - lVar18) - (long)psVar22;
    if (-1 < lVar18 &&
        (SBORROW8(0x7fffffffffffffff - lVar18,(long)psVar22) !=
        SBORROW8(lVar42,(ulong)((secp256k1_gej *)~uVar11 < psVar25))) !=
        (long)(lVar42 - (ulong)((secp256k1_gej *)~uVar11 < psVar25)) < 0) goto LAB_0014bd35;
    puVar35 = (uint64_t *)((long)(psVar25->x).n + uVar11);
    lVar36 = (long)(psVar22->x).n + (ulong)CARRY8(uVar11,(ulong)psVar25) + lVar18;
    uVar12 = uStack_260 * uVar1;
    lVar19 = SUB168(SEXT816((long)uStack_260) * SEXT816((long)uVar1),8);
    uVar13 = (long)psStack_258 * (long)psVar43;
    lVar20 = SUB168(SEXT816((long)psStack_258) * SEXT816((long)psVar43),8);
    uVar11 = (ulong)(-uVar13 - 1 < uVar12);
    lVar42 = (0x7fffffffffffffff - lVar20) - lVar19;
    lVar18 = lVar42 - uVar11;
    bVar44 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar19) != SBORROW8(lVar42,uVar11)) == lVar18 < 0
    ;
    psVar22 = (secp256k1_gej *)CONCAT71((int7)((ulong)lVar18 >> 8),lVar20 < 0 || bVar44);
    if (lVar20 >= 0 && !bVar44) goto LAB_0014bd3a;
    psVar23 = (secp256k1_gej *)((long)psStack_210 >> 0x3f);
    lStack_238 = ((ulong)psStack_248 & (ulong)psVar23) + (uStack_250 & (long)psStack_208 >> 0x3f);
    uVar31 = uVar13 + uVar12;
    psVar29 = (secp256k1_gej *)(lVar20 + lVar19 + (ulong)CARRY8(uVar13,uVar12));
    uVar1 = (psVar17->x).n[0];
    psVar25 = *(secp256k1_gej **)&(psVar17->x).magnitude;
    psVar22 = (secp256k1_gej *)0x3fffffffffffffff;
    lStack_238 = lStack_238 - ((long)psVar25 * (long)puVar35 + lStack_238 & 0x3fffffffffffffffU);
    uVar12 = lStack_238 * uVar1;
    lVar18 = SUB168(SEXT816(lStack_238) * SEXT816((long)uVar1),8);
    uVar11 = (ulong)((undefined1 *)(-uVar12 - 1) < puVar35);
    lVar42 = (0x7fffffffffffffff - lVar18) - lVar36;
    psVar43 = (secp256k1_gej *)((-0x8000000000000000 - lVar18) - (ulong)(uVar12 != 0));
    bVar44 = (SBORROW8(0x7fffffffffffffff - lVar18,lVar36) != SBORROW8(lVar42,uVar11)) ==
             (long)(lVar42 - uVar11) < 0;
    if (lVar18 < 0) {
      bVar44 = (SBORROW8(lVar36,(long)psVar43) !=
               SBORROW8(lVar36 - (long)psVar43,(ulong)(puVar35 < (undefined1 *)-uVar12))) ==
               (long)((lVar36 - (long)psVar43) - (ulong)(puVar35 < (undefined1 *)-uVar12)) < 0;
    }
    psStack_230 = a_01;
    psStack_220 = psVar17;
    if (!bVar44) goto LAB_0014bd3f;
    lVar42 = ((ulong)psVar23 & (ulong)psStack_258) + ((long)psStack_208 >> 0x3f & uStack_260);
    psVar23 = (secp256k1_gej *)(lVar42 - ((long)psVar25 * uVar31 + lVar42 & 0x3fffffffffffffff));
    lVar19 = lVar18 + lVar36 + (ulong)CARRY8(uVar12,(ulong)puVar35);
    uVar13 = (long)psVar23 * uVar1;
    lVar18 = SUB168(SEXT816((long)psVar23) * SEXT816((long)uVar1),8);
    uVar11 = (ulong)(-uVar13 - 1 < uVar31);
    lVar42 = (0x7fffffffffffffff - lVar18) - (long)psVar29;
    psVar25 = (secp256k1_gej *)((-0x8000000000000000 - lVar18) - (ulong)(uVar13 != 0));
    bVar44 = (SBORROW8(0x7fffffffffffffff - lVar18,(long)psVar29) != SBORROW8(lVar42,uVar11)) ==
             (long)(lVar42 - uVar11) < 0;
    if (lVar18 < 0) {
      bVar44 = (SBORROW8((long)psVar29,(long)psVar25) !=
               SBORROW8((long)psVar29 - (long)psVar25,(ulong)(uVar31 < -uVar13))) ==
               (long)(((long)psVar29 - (long)psVar25) - (ulong)(uVar31 < -uVar13)) < 0;
    }
    if (!bVar44) goto LAB_0014bd44;
    lVar42 = (long)(psVar29->x).n + (ulong)CARRY8(uVar13,uVar31) + lVar18;
    if (((long)puVar35 + uVar12 & 0x3fffffffffffffff) != 0) goto LAB_0014bd49;
    psVar8 = psVar23;
    if ((uVar13 + uVar31 & 0x3fffffffffffffff) != 0) goto LAB_0014bd4e;
    psVar8 = (secp256k1_gej *)0x8000000000000000;
    uVar11 = (ulong)((long)puVar35 + uVar12) >> 0x3e | lVar19 * 4;
    psVar22 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar33 = uStack_250 * (long)psStack_1e8 + uVar11;
    psVar29 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_250) * SEXT816((long)psStack_1e8),8) + (lVar19 >> 0x3e) +
              (ulong)CARRY8(uStack_250 * (long)psStack_1e8,uVar11));
    uVar12 = (long)psStack_248 * (long)psStack_1e0;
    lVar20 = SUB168(SEXT816((long)psStack_248) * SEXT816((long)psStack_1e0),8);
    uVar11 = (ulong)(-uVar12 - 1 < uVar33);
    lVar18 = (0x7fffffffffffffff - lVar20) - (long)psVar29;
    lVar36 = (-0x8000000000000000 - lVar20) - (ulong)(uVar12 != 0);
    lVar19 = (long)psVar29 - lVar36;
    bVar44 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar29) != SBORROW8(lVar18,uVar11)) ==
             (long)(lVar18 - uVar11) < 0;
    if (lVar20 < 0) {
      bVar44 = (SBORROW8((long)psVar29,lVar36) != SBORROW8(lVar19,(ulong)(uVar33 < -uVar12))) ==
               (long)(lVar19 - (ulong)(uVar33 < -uVar12)) < 0;
    }
    psVar25 = (secp256k1_gej *)(ulong)bVar44;
    a_02 = psStack_1e8;
    psVar43 = psStack_1e0;
    psStack_240 = psVar23;
    if (bVar44 == false) goto LAB_0014bd53;
    uVar11 = uVar13 + uVar31 >> 0x3e | lVar42 * 4;
    uVar13 = uVar33 + uVar12;
    psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + (ulong)CARRY8(uVar33,uVar12) + lVar20);
    uVar31 = uStack_260 * (long)psStack_1e8 + uVar11;
    lVar20 = SUB168(SEXT816((long)uStack_260) * SEXT816((long)psStack_1e8),8) + (lVar42 >> 0x3e) +
             (ulong)CARRY8(uStack_260 * (long)psStack_1e8,uVar11);
    uVar12 = (long)psStack_258 * (long)psStack_1e0;
    lVar19 = SUB168(SEXT816((long)psStack_258) * SEXT816((long)psStack_1e0),8);
    uVar11 = (ulong)(-uVar12 - 1 < uVar31);
    lVar42 = (0x7fffffffffffffff - lVar19) - lVar20;
    lVar36 = (-0x8000000000000000 - lVar19) - (ulong)(uVar12 != 0);
    lVar18 = lVar20 - lVar36;
    bVar44 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar20) != SBORROW8(lVar42,uVar11)) ==
             (long)(lVar42 - uVar11) < 0;
    if (lVar19 < 0) {
      bVar44 = (SBORROW8(lVar20,lVar36) != SBORROW8(lVar18,(ulong)(uVar31 < -uVar12))) ==
               (long)(lVar18 - (ulong)(uVar31 < -uVar12)) < 0;
    }
    psVar25 = (secp256k1_gej *)(ulong)bVar44;
    if (bVar44 == false) goto LAB_0014bd58;
    a_02 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar11 = uVar31 + uVar12;
    lVar42 = lVar20 + lVar19 + (ulong)CARRY8(uVar31,uVar12);
    uVar1 = (psVar17->x).n[1];
    if (uVar1 != 0) {
      uVar31 = uVar1 * lStack_238;
      lVar19 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_238),8);
      uVar12 = (ulong)(-uVar31 - 1 < uVar13);
      lVar18 = (0x7fffffffffffffff - lVar19) - (long)psVar29;
      psVar25 = (secp256k1_gej *)((-0x8000000000000000 - lVar19) - (ulong)(uVar31 != 0));
      bVar44 = (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar29) != SBORROW8(lVar18,uVar12)) ==
               (long)(lVar18 - uVar12) < 0;
      if (lVar19 < 0) {
        bVar44 = (SBORROW8((long)psVar29,(long)psVar25) !=
                 SBORROW8((long)psVar29 - (long)psVar25,(ulong)(uVar13 < -uVar31))) ==
                 (long)(((long)psVar29 - (long)psVar25) - (ulong)(uVar13 < -uVar31)) < 0;
      }
      psVar22 = psVar23;
      psVar30 = psStack_1e0;
      if (!bVar44) goto LAB_0014bda3;
      uVar33 = uVar1 * (long)psVar23;
      lVar36 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
      uVar12 = (ulong)(-uVar33 - 1 < uVar11);
      lVar18 = (0x7fffffffffffffff - lVar36) - lVar42;
      lVar41 = (-0x8000000000000000 - lVar36) - (ulong)(uVar33 != 0);
      lVar20 = lVar42 - lVar41;
      psVar30 = (secp256k1_gej *)(lVar20 - (ulong)(uVar11 < -uVar33));
      bVar44 = (SBORROW8(0x7fffffffffffffff - lVar36,lVar42) != SBORROW8(lVar18,uVar12)) ==
               (long)(lVar18 - uVar12) < 0;
      if (lVar36 < 0) {
        bVar44 = (SBORROW8(lVar42,lVar41) != SBORROW8(lVar20,(ulong)(uVar11 < -uVar33))) ==
                 (long)psVar30 < 0;
      }
      psVar25 = (secp256k1_gej *)(ulong)bVar44;
      if (bVar44 != false) {
        bVar44 = CARRY8(uVar13,uVar31);
        uVar13 = uVar13 + uVar31;
        psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + (ulong)bVar44 + lVar19);
        bVar44 = CARRY8(uVar11,uVar33);
        uVar11 = uVar11 + uVar33;
        lVar42 = lVar42 + lVar36 + (ulong)bVar44;
        goto LAB_0014b677;
      }
      goto LAB_0014bda8;
    }
LAB_0014b677:
    uVar12 = (long)psVar29 << 2 | uVar13 >> 0x3e;
    uVar33 = uStack_250 * (long)psStack_1f8 + uVar12;
    psVar29 = (secp256k1_gej *)
              (((long)psVar29 >> 0x3e) +
               SUB168(SEXT816((long)uStack_250) * SEXT816((long)psStack_1f8),8) +
              (ulong)CARRY8(uStack_250 * (long)psStack_1f8,uVar12));
    uVar31 = (long)psStack_248 * uStack_1f0;
    lVar20 = SUB168(SEXT816((long)psStack_248) * SEXT816((long)uStack_1f0),8);
    uVar12 = (ulong)(-uVar31 - 1 < uVar33);
    lVar18 = (0x7fffffffffffffff - lVar20) - (long)psVar29;
    lVar36 = (-0x8000000000000000 - lVar20) - (ulong)(uVar31 != 0);
    lVar19 = (long)psVar29 - lVar36;
    (psStack_228->x).n[0] = uVar13 & 0x3fffffffffffffff;
    (a_01->x).n[0] = uVar11 & 0x3fffffffffffffff;
    bVar44 = (SBORROW8((long)psVar29,lVar36) != SBORROW8(lVar19,(ulong)(uVar33 < -uVar31))) ==
             (long)(lVar19 - (ulong)(uVar33 < -uVar31)) < 0;
    psVar25 = (secp256k1_gej *)(ulong)bVar44;
    bVar5 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar29) != SBORROW8(lVar18,uVar12)) ==
            (long)(lVar18 - uVar12) < 0;
    if (lVar20 < 0) {
      bVar5 = bVar44;
    }
    psVar22 = psStack_1f8;
    psVar43 = psStack_228;
    if (!bVar5) goto LAB_0014bd5d;
    uVar11 = uVar11 >> 0x3e | lVar42 << 2;
    uVar32 = uVar33 + uVar31;
    psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + (ulong)CARRY8(uVar33,uVar31) + lVar20);
    uVar13 = uStack_260 * (long)psStack_1f8 + uVar11;
    lVar19 = SUB168(SEXT816((long)uStack_260) * SEXT816((long)psStack_1f8),8) + (lVar42 >> 0x3e) +
             (ulong)CARRY8(uStack_260 * (long)psStack_1f8,uVar11);
    uVar12 = (long)psStack_258 * uStack_1f0;
    lVar18 = SUB168(SEXT816((long)psStack_258) * SEXT816((long)uStack_1f0),8);
    uVar11 = (ulong)(-uVar12 - 1 < uVar13);
    lVar42 = (0x7fffffffffffffff - lVar18) - lVar19;
    psVar22 = (secp256k1_gej *)0x8000000000000000;
    psVar8 = (secp256k1_gej *)((-0x8000000000000000 - lVar18) - (ulong)(uVar12 != 0));
    bVar44 = (SBORROW8(0x7fffffffffffffff - lVar18,lVar19) != SBORROW8(lVar42,uVar11)) ==
             (long)(lVar42 - uVar11) < 0;
    if (lVar18 < 0) {
      bVar44 = (SBORROW8(lVar19,(long)psVar8) !=
               SBORROW8(lVar19 - (long)psVar8,(ulong)(uVar13 < -uVar12))) ==
               (long)((lVar19 - (long)psVar8) - (ulong)(uVar13 < -uVar12)) < 0;
    }
    psVar25 = (secp256k1_gej *)(ulong)bVar44;
    if (bVar44 == false) goto LAB_0014bd62;
    uVar11 = uVar13 + uVar12;
    lVar42 = lVar19 + lVar18 + (ulong)CARRY8(uVar13,uVar12);
    uVar1 = (psVar17->x).n[2];
    if (uVar1 != 0) {
      uVar13 = uVar1 * lStack_238;
      lVar19 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_238),8);
      uVar12 = (ulong)(-uVar13 - 1 < uVar32);
      lVar18 = (0x7fffffffffffffff - lVar19) - (long)psVar29;
      psVar25 = (secp256k1_gej *)((-0x8000000000000000 - lVar19) - (ulong)(uVar13 != 0));
      bVar44 = (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar29) != SBORROW8(lVar18,uVar12)) ==
               (long)(lVar18 - uVar12) < 0;
      if (lVar19 < 0) {
        bVar44 = (SBORROW8((long)psVar29,(long)psVar25) !=
                 SBORROW8((long)psVar29 - (long)psVar25,(ulong)(uVar32 < -uVar13))) ==
                 (long)(((long)psVar29 - (long)psVar25) - (ulong)(uVar32 < -uVar13)) < 0;
      }
      psVar30 = psStack_228;
      if (!bVar44) goto LAB_0014bdad;
      uVar31 = uVar1 * (long)psVar23;
      lVar36 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
      uVar12 = (ulong)(-uVar31 - 1 < uVar11);
      lVar18 = (0x7fffffffffffffff - lVar36) - lVar42;
      lVar41 = (-0x8000000000000000 - lVar36) - (ulong)(uVar31 != 0);
      lVar20 = lVar42 - lVar41;
      psVar30 = (secp256k1_gej *)
                (ulong)((SBORROW8(lVar42,lVar41) != SBORROW8(lVar20,(ulong)(uVar11 < -uVar31))) ==
                       (long)(lVar20 - (ulong)(uVar11 < -uVar31)) < 0);
      psVar25 = (secp256k1_gej *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar36,lVar42) != SBORROW8(lVar18,uVar12)) ==
                       (long)(lVar18 - uVar12) < 0);
      if (lVar36 < 0) {
        psVar25 = psVar30;
      }
      if ((char)psVar25 != '\0') {
        bVar44 = CARRY8(uVar32,uVar13);
        uVar32 = uVar32 + uVar13;
        psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + (ulong)bVar44 + lVar19);
        bVar44 = CARRY8(uVar11,uVar31);
        uVar11 = uVar11 + uVar31;
        lVar42 = lVar42 + lVar36 + (ulong)bVar44;
        goto LAB_0014b871;
      }
      goto LAB_0014bdb2;
    }
LAB_0014b871:
    a_02 = (secp256k1_gej *)0x8000000000000000;
    psVar8 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar12 = (long)psVar29 << 2 | uVar32 >> 0x3e;
    uVar31 = uStack_250 * uStack_218 + uVar12;
    psVar29 = (secp256k1_gej *)
              (((long)psVar29 >> 0x3e) +
               SUB168(SEXT816((long)uStack_250) * SEXT816((long)uStack_218),8) +
              (ulong)CARRY8(uStack_250 * uStack_218,uVar12));
    uVar13 = (long)psStack_248 * (long)psStack_200;
    lVar20 = SUB168(SEXT816((long)psStack_248) * SEXT816((long)psStack_200),8);
    uVar12 = (ulong)(-uVar13 - 1 < uVar31);
    lVar18 = (0x7fffffffffffffff - lVar20) - (long)psVar29;
    lVar36 = (-0x8000000000000000 - lVar20) - (ulong)(uVar13 != 0);
    lVar19 = (long)psVar29 - lVar36;
    (psStack_228->x).n[1] = uVar32 & 0x3fffffffffffffff;
    (a_01->x).n[1] = uVar11 & 0x3fffffffffffffff;
    bVar44 = (SBORROW8((long)psVar29,lVar36) != SBORROW8(lVar19,(ulong)(uVar31 < -uVar13))) ==
             (long)(lVar19 - (ulong)(uVar31 < -uVar13)) < 0;
    psVar25 = (secp256k1_gej *)(ulong)bVar44;
    bVar5 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar29) != SBORROW8(lVar18,uVar12)) ==
            (long)(lVar18 - uVar12) < 0;
    if (lVar20 < 0) {
      bVar5 = bVar44;
    }
    psVar22 = psStack_200;
    if (!bVar5) goto LAB_0014bd67;
    uVar11 = uVar11 >> 0x3e | lVar42 << 2;
    uVar33 = uVar31 + uVar13;
    psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + (ulong)CARRY8(uVar31,uVar13) + lVar20);
    uVar13 = uStack_260 * uStack_218 + uVar11;
    lVar19 = SUB168(SEXT816((long)uStack_260) * SEXT816((long)uStack_218),8) + (lVar42 >> 0x3e) +
             (ulong)CARRY8(uStack_260 * uStack_218,uVar11);
    uVar12 = (long)psStack_258 * (long)psStack_200;
    lVar18 = SUB168(SEXT816((long)psStack_258) * SEXT816((long)psStack_200),8);
    uVar11 = (ulong)(-uVar12 - 1 < uVar13);
    lVar42 = (0x7fffffffffffffff - lVar18) - lVar19;
    psVar8 = (secp256k1_gej *)(lVar42 - uVar11);
    psVar22 = (secp256k1_gej *)0x8000000000000000;
    a_02 = (secp256k1_gej *)((-0x8000000000000000 - lVar18) - (ulong)(uVar12 != 0));
    bVar44 = (SBORROW8(0x7fffffffffffffff - lVar18,lVar19) != SBORROW8(lVar42,uVar11)) ==
             (long)psVar8 < 0;
    if (lVar18 < 0) {
      bVar44 = (SBORROW8(lVar19,(long)a_02) !=
               SBORROW8(lVar19 - (long)a_02,(ulong)(uVar13 < -uVar12))) ==
               (long)((lVar19 - (long)a_02) - (ulong)(uVar13 < -uVar12)) < 0;
    }
    psVar25 = (secp256k1_gej *)(ulong)bVar44;
    if (bVar44 == false) goto LAB_0014bd6c;
    uVar11 = uVar13 + uVar12;
    lVar42 = lVar19 + lVar18 + (ulong)CARRY8(uVar13,uVar12);
    uVar1 = (psVar17->x).n[3];
    if (uVar1 == 0) {
LAB_0014ba54:
      a_02 = (secp256k1_gej *)0x8000000000000000;
      uVar12 = (long)psVar29 << 2 | uVar33 >> 0x3e;
      uVar31 = uStack_250 * (long)psStack_208 + uVar12;
      psVar29 = (secp256k1_gej *)
                (((long)psVar29 >> 0x3e) +
                 SUB168(SEXT816((long)uStack_250) * SEXT816((long)psStack_208),8) +
                (ulong)CARRY8(uStack_250 * (long)psStack_208,uVar12));
      uVar13 = (long)psStack_248 * (long)psStack_210;
      lVar20 = SUB168(SEXT816((long)psStack_248) * SEXT816((long)psStack_210),8);
      uVar12 = (ulong)(-uVar13 - 1 < uVar31);
      lVar18 = (0x7fffffffffffffff - lVar20) - (long)psVar29;
      lVar36 = (-0x8000000000000000 - lVar20) - (ulong)(uVar13 != 0);
      lVar19 = (long)psVar29 - lVar36;
      (psStack_228->x).n[2] = uVar33 & 0x3fffffffffffffff;
      (a_01->x).n[2] = uVar11 & 0x3fffffffffffffff;
      bVar44 = (SBORROW8((long)psVar29,lVar36) != SBORROW8(lVar19,(ulong)(uVar31 < -uVar13))) ==
               (long)(lVar19 - (ulong)(uVar31 < -uVar13)) < 0;
      psVar25 = (secp256k1_gej *)(ulong)bVar44;
      bVar5 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar29) != SBORROW8(lVar18,uVar12)) ==
              (long)(lVar18 - uVar12) < 0;
      if (lVar20 < 0) {
        bVar5 = bVar44;
      }
      psVar22 = psStack_210;
      psVar8 = psStack_208;
      if (!bVar5) goto LAB_0014bd71;
      uVar11 = uVar11 >> 0x3e | lVar42 << 2;
      uVar33 = uVar31 + uVar13;
      psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + (ulong)CARRY8(uVar31,uVar13) + lVar20);
      uVar13 = uStack_260 * (long)psStack_208 + uVar11;
      lVar20 = SUB168(SEXT816((long)uStack_260) * SEXT816((long)psStack_208),8) + (lVar42 >> 0x3e) +
               (ulong)CARRY8(uStack_260 * (long)psStack_208,uVar11);
      uVar12 = (long)psStack_258 * (long)psStack_210;
      lVar19 = SUB168(SEXT816((long)psStack_258) * SEXT816((long)psStack_210),8);
      uVar11 = (ulong)(-uVar12 - 1 < uVar13);
      lVar42 = (0x7fffffffffffffff - lVar19) - lVar20;
      lVar36 = (-0x8000000000000000 - lVar19) - (ulong)(uVar12 != 0);
      lVar18 = lVar20 - lVar36;
      bVar44 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar20) != SBORROW8(lVar42,uVar11)) ==
               (long)(lVar42 - uVar11) < 0;
      if (lVar19 < 0) {
        bVar44 = (SBORROW8(lVar20,lVar36) != SBORROW8(lVar18,(ulong)(uVar13 < -uVar12))) ==
                 (long)(lVar18 - (ulong)(uVar13 < -uVar12)) < 0;
      }
      psVar25 = (secp256k1_gej *)(ulong)bVar44;
      if (bVar44 == false) goto LAB_0014bd76;
      uVar31 = uVar13 + uVar12;
      lVar18 = lVar20 + lVar19 + (ulong)CARRY8(uVar13,uVar12);
      uVar1 = (psVar17->x).n[4];
      uVar12 = uVar1 * lStack_238;
      psVar25 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_238),8);
      uVar11 = (ulong)(-uVar12 - 1 < uVar33);
      lVar42 = (0x7fffffffffffffff - (long)psVar25) - (long)psVar29;
      psVar43 = (secp256k1_gej *)((-0x8000000000000000 - (long)psVar25) - (ulong)(uVar12 != 0));
      bVar44 = (SBORROW8(0x7fffffffffffffff - (long)psVar25,(long)psVar29) !=
               SBORROW8(lVar42,uVar11)) == (long)(lVar42 - uVar11) < 0;
      if ((long)psVar25 < 0) {
        bVar44 = (SBORROW8((long)psVar29,(long)psVar43) !=
                 SBORROW8((long)psVar29 - (long)psVar43,(ulong)(uVar33 < -uVar12))) ==
                 (long)(((long)psVar29 - (long)psVar43) - (ulong)(uVar33 < -uVar12)) < 0;
      }
      if (!bVar44) goto LAB_0014bd7b;
      uVar13 = uVar1 * (long)psVar23;
      lVar19 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
      psVar8 = (secp256k1_gej *)0x8000000000000000;
      uVar11 = (ulong)(-uVar13 - 1 < uVar31);
      lVar42 = (0x7fffffffffffffff - lVar19) - lVar18;
      a_02 = (secp256k1_gej *)((-0x8000000000000000 - lVar19) - (ulong)(uVar13 != 0));
      bVar44 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar18) != SBORROW8(lVar42,uVar11)) ==
               (long)(lVar42 - uVar11) < 0;
      if (lVar19 < 0) {
        bVar44 = (SBORROW8(lVar18,(long)a_02) !=
                 SBORROW8(lVar18 - (long)a_02,(ulong)(uVar31 < -uVar13))) ==
                 (long)((lVar18 - (long)a_02) - (ulong)(uVar31 < -uVar13)) < 0;
      }
      psVar22 = (secp256k1_gej *)(ulong)bVar44;
      if (bVar44 == false) goto LAB_0014bd80;
      lVar20 = (long)(psVar25->x).n + (ulong)CARRY8(uVar12,uVar33) + (long)(psVar29->x).n;
      lVar42 = lVar19 + lVar18 + (ulong)CARRY8(uVar13,uVar31);
      psVar22 = (secp256k1_gej *)(lVar20 * 4 | uVar12 + uVar33 >> 0x3e);
      (psStack_228->x).n[3] = uVar12 + uVar33 & 0x3fffffffffffffff;
      (a_01->x).n[3] = uVar13 + uVar31 & 0x3fffffffffffffff;
      psVar29 = (secp256k1_gej *)&psVar22[0xd79435e50d7943].x.magnitude;
      psVar25 = (secp256k1_gej *)
                ((lVar20 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar22));
      if (psVar25 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_0014bd85;
      psVar25 = (secp256k1_gej *)0xffffffffffffffff;
      uVar11 = uVar13 + uVar31 >> 0x3e | lVar42 * 4;
      (psStack_228->x).n[4] = (uint64_t)psVar22;
      psVar8 = (secp256k1_gej *)(uVar11 + 0x8000000000000000);
      if ((lVar42 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar11) != -1) goto LAB_0014bd8a;
      (a_01->x).n[4] = uVar11;
      psVar25 = (secp256k1_gej *)0x5;
      psVar22 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_268 = (secp256k1_gej *)0x14bca4;
      psVar29 = psStack_228;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psStack_228,5,
                         (secp256k1_modinv64_signed62 *)psVar17,-2);
      if (iVar6 < 1) goto LAB_0014bd8f;
      psVar22 = (secp256k1_gej *)0x1;
      psVar25 = (secp256k1_gej *)0x5;
      psStack_268 = (secp256k1_gej *)0x14bcc1;
      psVar29 = psVar28;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar28,5,
                         (secp256k1_modinv64_signed62 *)psVar17,1);
      if (-1 < iVar6) goto LAB_0014bd94;
      psVar25 = (secp256k1_gej *)0x5;
      psVar22 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_268 = (secp256k1_gej *)0x14bce0;
      psVar29 = a_01;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,5,
                         (secp256k1_modinv64_signed62 *)psVar17,-2);
      if (iVar6 < 1) goto LAB_0014bd99;
      psVar22 = (secp256k1_gej *)0x1;
      psVar25 = (secp256k1_gej *)0x5;
      psStack_268 = (secp256k1_gej *)0x14bcfd;
      psVar29 = a_01;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,5,
                         (secp256k1_modinv64_signed62 *)psVar17,1);
      if (iVar6 < 0) {
        return iVar6;
      }
      goto LAB_0014bd9e;
    }
    psVar8 = (secp256k1_gej *)(uVar1 * lStack_238);
    lVar19 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_238),8);
    uVar12 = (ulong)(-(long)psVar8 - 1U < uVar33);
    lVar18 = (0x7fffffffffffffff - lVar19) - (long)psVar29;
    a_02 = (secp256k1_gej *)0x8000000000000000;
    psVar25 = (secp256k1_gej *)
              ((-0x8000000000000000 - lVar19) - (ulong)(psVar8 != (secp256k1_gej *)0x0));
    bVar44 = (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar29) != SBORROW8(lVar18,uVar12)) ==
             (long)(lVar18 - uVar12) < 0;
    if (lVar19 < 0) {
      bVar44 = (SBORROW8((long)psVar29,(long)psVar25) !=
               SBORROW8((long)psVar29 - (long)psVar25,(ulong)(uVar33 < (ulong)-(long)psVar8))) ==
               (long)(((long)psVar29 - (long)psVar25) - (ulong)(uVar33 < (ulong)-(long)psVar8)) < 0;
    }
    psVar30 = psStack_228;
    if (!bVar44) goto LAB_0014bdb7;
    uVar13 = uVar1 * (long)psVar23;
    lVar36 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
    uVar12 = (ulong)(-uVar13 - 1 < uVar11);
    lVar18 = (0x7fffffffffffffff - lVar36) - lVar42;
    lVar41 = (-0x8000000000000000 - lVar36) - (ulong)(uVar13 != 0);
    lVar20 = lVar42 - lVar41;
    psVar30 = (secp256k1_gej *)(lVar20 - (ulong)(uVar11 < -uVar13));
    bVar44 = (SBORROW8(0x7fffffffffffffff - lVar36,lVar42) != SBORROW8(lVar18,uVar12)) ==
             (long)(lVar18 - uVar12) < 0;
    if (lVar36 < 0) {
      bVar44 = (SBORROW8(lVar42,lVar41) != SBORROW8(lVar20,(ulong)(uVar11 < -uVar13))) ==
               (long)psVar30 < 0;
    }
    uVar7 = (uint)bVar44;
    if (bVar44 != false) {
      bVar44 = CARRY8(uVar33,(ulong)psVar8);
      uVar33 = (long)(psVar8->x).n + uVar33;
      psVar29 = (secp256k1_gej *)((long)(psVar29->x).n + (ulong)bVar44 + lVar19);
      bVar44 = CARRY8(uVar11,uVar13);
      uVar11 = uVar11 + uVar13;
      lVar42 = lVar42 + lVar36 + (ulong)bVar44;
      goto LAB_0014ba54;
    }
  }
  psStack_268 = (secp256k1_gej *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  a_03 = &sStack_2c8;
  psStack_278 = psVar8;
  psStack_270 = a_02;
  psStack_268 = psVar30;
  secp256k1_modinv64_mul_62(&sStack_2a0,(secp256k1_modinv64_signed62 *)psVar29,uVar7,1);
  psVar26 = a_00;
  secp256k1_modinv64_mul_62(&sStack_2c8,a_00,5,(int64_t)psVar23);
  lVar42 = 0;
  while ((ulong)sStack_2a0.v[lVar42] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_2c8.v[lVar42]) goto LAB_0014be51;
    lVar42 = lVar42 + 1;
    if (lVar42 == 4) {
      uVar7 = 4;
      while( true ) {
        if (sStack_2a0.v[uVar7] < sStack_2c8.v[uVar7]) {
          return -1;
        }
        if (sStack_2c8.v[uVar7] < sStack_2a0.v[uVar7]) break;
        bVar44 = uVar7 == 0;
        uVar7 = uVar7 - 1;
        if (bVar44) {
          return 0;
        }
      }
      return 1;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0014be51:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar6 = (int)a_03;
  if (iVar6 < 1) {
LAB_0014c110:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0014c115:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_0014c11a:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0014c11f:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_0014c124:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0014c129:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar1 = (psVar23->x).n[0];
    uVar2 = (psVar23->x).n[1];
    lVar42 = psVar26->v[0];
    lVar18 = *extraout_RDX_00;
    uVar11 = lVar42 * uVar1;
    lVar20 = SUB168(SEXT816(lVar42) * SEXT816((long)uVar1),8);
    uVar12 = lVar18 * uVar2;
    lVar36 = SUB168(SEXT816(lVar18) * SEXT816((long)uVar2),8);
    lVar19 = (0x7fffffffffffffff - lVar36) - lVar20;
    if (-1 < lVar36 &&
        (SBORROW8(0x7fffffffffffffff - lVar36,lVar20) != SBORROW8(lVar19,(ulong)(~uVar12 < uVar11)))
        != (long)(lVar19 - (ulong)(~uVar12 < uVar11)) < 0) goto LAB_0014c115;
    uVar3 = (psVar23->x).n[2];
    lVar20 = lVar36 + lVar20 + (ulong)CARRY8(uVar12,uVar11);
    uVar4 = (psVar23->x).n[3];
    uVar31 = lVar42 * uVar3;
    lVar19 = SUB168(SEXT816(lVar42) * SEXT816((long)uVar3),8);
    uVar33 = lVar18 * uVar4;
    lVar18 = SUB168(SEXT816(lVar18) * SEXT816((long)uVar4),8);
    uVar13 = (ulong)(-uVar33 - 1 < uVar31);
    lVar42 = (0x7fffffffffffffff - lVar18) - lVar19;
    if (-1 < lVar18 &&
        (SBORROW8(0x7fffffffffffffff - lVar18,lVar19) != SBORROW8(lVar42,uVar13)) !=
        (long)(lVar42 - uVar13) < 0) goto LAB_0014c11a;
    lVar42 = lVar18 + lVar19 + (ulong)CARRY8(uVar33,uVar31);
    if ((uVar12 + uVar11 & 0x3fffffffffffffff) != 0) goto LAB_0014c11f;
    if ((uVar33 + uVar31 & 0x3fffffffffffffff) != 0) goto LAB_0014c124;
    uVar13 = uVar33 + uVar31 >> 0x3e | lVar42 * 4;
    uVar11 = uVar12 + uVar11 >> 0x3e | lVar20 * 4;
    lVar42 = lVar42 >> 0x3e;
    lVar20 = lVar20 >> 0x3e;
    if (iVar6 != 1) {
      psVar14 = (secp256k1_modinv64_signed62 *)((ulong)a_03 & 0xffffffff);
      a_03 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar18 = psVar26->v[(long)a_03];
        uVar31 = lVar18 * uVar1 + uVar11;
        lVar24 = SUB168(SEXT816(lVar18) * SEXT816((long)uVar1),8) + lVar20 +
                 (ulong)CARRY8(lVar18 * uVar1,uVar11);
        lVar19 = extraout_RDX_00[(long)a_03];
        uVar12 = lVar19 * uVar2;
        lVar41 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar2),8);
        uVar11 = (ulong)(-uVar12 - 1 < uVar31);
        lVar20 = (0x7fffffffffffffff - lVar41) - lVar24;
        psVar27 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar39 = (-0x8000000000000000 - lVar41) - (ulong)(uVar12 != 0);
        lVar36 = lVar24 - lVar39;
        bVar44 = (SBORROW8(0x7fffffffffffffff - lVar41,lVar24) != SBORROW8(lVar20,uVar11)) ==
                 (long)(lVar20 - uVar11) < 0;
        if (lVar41 < 0) {
          bVar44 = (SBORROW8(lVar24,lVar39) != SBORROW8(lVar36,(ulong)(uVar31 < -uVar12))) ==
                   (long)(lVar36 - (ulong)(uVar31 < -uVar12)) < 0;
        }
        if (!bVar44) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_0014c10b:
          psVar26 = psVar27;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_0014c110;
        }
        uVar32 = lVar18 * uVar3 + uVar13;
        lVar36 = SUB168(SEXT816(lVar18) * SEXT816((long)uVar3),8) + lVar42 +
                 (ulong)CARRY8(lVar18 * uVar3,uVar13);
        uVar33 = lVar19 * uVar4;
        lVar19 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar4),8);
        uVar11 = (ulong)(-uVar33 - 1 < uVar32);
        lVar42 = (0x7fffffffffffffff - lVar19) - lVar36;
        lVar20 = (-0x8000000000000000 - lVar19) - (ulong)(uVar33 != 0);
        lVar18 = lVar36 - lVar20;
        bVar44 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar36) != SBORROW8(lVar42,uVar11)) ==
                 (long)(lVar42 - uVar11) < 0;
        if (lVar19 < 0) {
          bVar44 = (SBORROW8(lVar36,lVar20) != SBORROW8(lVar18,(ulong)(uVar32 < -uVar33))) ==
                   (long)(lVar18 - (ulong)(uVar32 < -uVar33)) < 0;
        }
        if (!bVar44) goto LAB_0014c10b;
        lVar20 = lVar41 + lVar24 + (ulong)CARRY8(uVar12,uVar31);
        lVar42 = lVar19 + lVar36 + (ulong)CARRY8(uVar33,uVar32);
        uVar11 = lVar20 * 4 | uVar12 + uVar31 >> 0x3e;
        psVar26->v[(long)((long)a_03[-1].v + 0x27)] = uVar12 + uVar31 & 0x3fffffffffffffff;
        uVar13 = lVar42 * 4 | uVar33 + uVar32 >> 0x3e;
        extraout_RDX_00[(long)((long)a_03[-1].v + 0x27)] = uVar33 + uVar32 & 0x3fffffffffffffff;
        a_03 = (secp256k1_modinv64_signed62 *)((long)a_03->v + 1);
        lVar42 = lVar42 >> 0x3e;
        lVar20 = lVar20 >> 0x3e;
      } while (psVar14 != a_03);
    }
    if (lVar20 + -1 + (ulong)(0x7fffffffffffffff < uVar11) != -1) goto LAB_0014c129;
    psVar26->v[(long)iVar6 + -1] = uVar11;
    if (lVar42 + -1 + (ulong)(0x7fffffffffffffff < uVar13) == -1) {
      lVar42 = (long)iVar6 + -1;
      extraout_RDX_00[lVar42] = uVar13;
      return (int)lVar42;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar42 = a_03->v[0];
  lVar18 = a_03->v[1];
  psVar14 = (secp256k1_modinv64_signed62 *)a_03->v[2];
  lVar19 = a_03->v[3];
  lVar20 = a_03->v[4];
  lVar36 = 0;
  do {
    if (a_03->v[lVar36] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
      psVar27 = psVar14;
LAB_0014c35f:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0014c364;
    }
    psVar27 = psVar14;
    if (0x3fffffffffffffff < a_03->v[lVar36]) goto LAB_0014c35f;
    lVar36 = lVar36 + 1;
  } while (lVar36 != 5);
  psVar27 = a_03;
  iVar6 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,-2);
  if (iVar6 < 1) {
LAB_0014c364:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0014c369:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014c36e:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    psVar27 = a_03;
    iVar6 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,1);
    if (-1 < iVar6) goto LAB_0014c369;
    uVar11 = lVar20 >> 0x3f;
    uVar31 = (long)psVar26 >> 0x3f;
    uVar12 = ((uVar11 & b->v[0]) + lVar42 ^ uVar31) - uVar31;
    uVar33 = ((long)uVar12 >> 0x3e) + (((uVar11 & b->v[1]) + lVar18 ^ uVar31) - uVar31);
    uVar32 = ((long)uVar33 >> 0x3e) + (((long)psVar14->v + (uVar11 & b->v[2]) ^ uVar31) - uVar31);
    uVar13 = ((long)uVar32 >> 0x3e) + (((uVar11 & b->v[3]) + lVar19 ^ uVar31) - uVar31);
    lVar42 = ((long)uVar13 >> 0x3e) + (((uVar11 & b->v[4]) + lVar20 ^ uVar31) - uVar31);
    uVar31 = lVar42 >> 0x3f;
    uVar11 = (b->v[0] & uVar31) + (uVar12 & 0x3fffffffffffffff);
    psVar27 = (secp256k1_modinv64_signed62 *)((b->v[4] & uVar31) + lVar42);
    uVar33 = ((long)uVar11 >> 0x3e) + (b->v[1] & uVar31) + (uVar33 & 0x3fffffffffffffff);
    uVar12 = ((long)uVar33 >> 0x3e) + (b->v[2] & uVar31) + (uVar32 & 0x3fffffffffffffff);
    uVar13 = ((long)uVar12 >> 0x3e) + (b->v[3] & uVar31) + (uVar13 & 0x3fffffffffffffff);
    uVar31 = (long)psVar27->v + ((long)uVar13 >> 0x3e);
    a_03->v[0] = uVar11 & 0x3fffffffffffffff;
    a_03->v[1] = uVar33 & 0x3fffffffffffffff;
    a_03->v[2] = uVar12 & 0x3fffffffffffffff;
    a_03->v[3] = uVar13 & 0x3fffffffffffffff;
    a_03->v[4] = uVar31;
    if (0x3fffffffffffffff < uVar31) goto LAB_0014c36e;
    psVar27 = a_03;
    iVar6 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,0);
    if (-1 < iVar6) {
      iVar6 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,1);
      if (iVar6 < 0) {
        return iVar6;
      }
      goto LAB_0014c378;
    }
  }
  a_03 = psVar27;
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0014c378:
  secp256k1_modinv64_normalize_62_cold_1();
  if ((long)a_03 < 1) {
    a_03 = (secp256k1_modinv64_signed62 *)-(long)a_03;
  }
  return (int)a_03;
}

Assistant:

static int secp256k1_gej_eq_x_var(const secp256k1_fe *x, const secp256k1_gej *a) {
    secp256k1_fe r;
    SECP256K1_FE_VERIFY(x);
    SECP256K1_GEJ_VERIFY(a);
    VERIFY_CHECK(!a->infinity);

    secp256k1_fe_sqr(&r, &a->z); secp256k1_fe_mul(&r, &r, x);
    return secp256k1_fe_equal(&r, &a->x);
}